

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O1

int __thiscall duckdb::Linenoise::CompleteLine(Linenoise *this,EscapeSequence *current_sequence)

{
  pointer pcVar1;
  char *__s;
  size_t __maxlen;
  bool bVar2;
  char cVar3;
  EscapeSequence EVar4;
  int iVar5;
  reference pvVar6;
  ssize_t sVar7;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined4 extraout_var;
  long lVar9;
  ulong __n;
  Linenoise *pLVar10;
  undefined1 **ppuVar11;
  byte bVar12;
  char c;
  TabCompletion completion_list;
  Linenoise saved;
  char local_111;
  TabCompletion local_110;
  EscapeSequence *local_f8;
  ulong local_f0;
  vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *local_e8;
  vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 local_c8 [24];
  size_t local_b0;
  size_t local_a0;
  undefined4 local_78;
  undefined2 local_74;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_> local_50;
  size_t local_38;
  undefined8 uVar8;
  
  bVar12 = 0;
  local_111 = '\0';
  local_f8 = current_sequence;
  TabComplete(&local_110,this);
  if (local_110.completions.super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
      super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_110.completions.super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
      super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    Terminal::Beep();
  }
  else {
    local_e8 = &local_50;
    local_e0 = &this->search_matches;
    local_f0 = 0;
    __n = 0;
    bVar2 = false;
    do {
      if (__n < (ulong)(((long)local_110.completions.
                               super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               .
                               super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_110.completions.
                               super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               .
                               super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                       )) {
        pLVar10 = this;
        ppuVar11 = &local_d8;
        for (lVar9 = 0xc; lVar9 != 0; lVar9 = lVar9 + -1) {
          *ppuVar11 = *(undefined1 **)pLVar10;
          pLVar10 = (Linenoise *)((long)pLVar10 + (ulong)bVar12 * -0x10 + 8);
          ppuVar11 = ppuVar11 + (ulong)bVar12 * -2 + 1;
        }
        local_74._0_1_ = this->has_more_data;
        local_74._1_1_ = this->insert;
        local_78._0_1_ = this->clear_screen;
        local_78._1_1_ = this->continuation_markers;
        local_78._2_1_ = this->search;
        local_78._3_1_ = this->render;
        local_70[0] = local_60;
        pcVar1 = (this->search_buf)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_70,pcVar1,pcVar1 + (this->search_buf)._M_string_length);
        ::std::vector<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>::vector
                  (local_e8,local_e0);
        local_38 = this->search_index;
        pvVar6 = vector<duckdb::Completion,_true>::operator[](&local_110.completions,__n);
        this->len = (pvVar6->completion)._M_string_length;
        pvVar6 = vector<duckdb::Completion,_true>::operator[](&local_110.completions,__n);
        this->pos = pvVar6->cursor_pos;
        pvVar6 = vector<duckdb::Completion,_true>::operator[](&local_110.completions,__n);
        this->buf = (pvVar6->completion)._M_dataplus._M_p;
        RefreshLine(this);
        this->len = local_a0;
        this->pos = local_b0;
        this->buf = local_d0;
        if (local_50.super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.
                          super__Vector_base<duckdb::searchMatch,_std::allocator<duckdb::searchMatch>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_70[0] != local_60) {
          operator_delete(local_70[0]);
        }
      }
      else {
        RefreshLine(this);
      }
      sVar7 = ::read(this->ifd,&local_111,1);
      if ((int)sVar7 < 1) {
        iVar5 = -1;
        goto LAB_00220848;
      }
      local_d8 = local_c8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"\nComplete Character %d\n","");
      cVar3 = local_111;
      uVar8 = extraout_RAX;
      if (local_d8 != local_c8) {
        operator_delete(local_d8);
        uVar8 = extraout_RAX_00;
      }
      if (cVar3 == '\t') {
        __n = (__n + 1) %
              (ulong)(((long)local_110.completions.
                             super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                             super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_110.completions.
                             super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
                             super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
      }
      else if (cVar3 == '\x1b') {
        EVar4 = Terminal::ReadEscapeSequence(this->ifd);
        uVar8 = CONCAT44(extraout_var,EVar4);
        if (EVar4 == SHIFT_TAB) {
          if (__n == 0) {
            RefreshLine(this);
            *local_f8 = SHIFT_TAB;
            bVar2 = true;
            __n = 0;
          }
          else {
            __n = __n - 1;
          }
        }
        else {
          if (EVar4 != ESCAPE) {
            *local_f8 = EVar4;
            goto LAB_0022078c;
          }
          RefreshLine(this);
          *local_f8 = ESCAPE;
          bVar2 = true;
        }
      }
      else {
LAB_0022078c:
        bVar2 = true;
        local_f0 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
      }
      if (((bVar2) && ((local_f0 & 1) != 0)) &&
         (__n < (ulong)(((long)local_110.completions.
                               super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               .
                               super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_110.completions.
                               super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               .
                               super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333
                       ))) {
        __s = this->buf;
        __maxlen = this->buflen;
        pvVar6 = vector<duckdb::Completion,_true>::operator[](&local_110.completions,__n);
        iVar5 = snprintf(__s,__maxlen,"%s",(pvVar6->completion)._M_dataplus._M_p);
        pvVar6 = vector<duckdb::Completion,_true>::operator[](&local_110.completions,__n);
        this->pos = pvVar6->cursor_pos;
        this->len = (long)iVar5;
      }
    } while (!bVar2);
  }
  iVar5 = (int)local_111;
LAB_00220848:
  ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::~vector
            ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)&local_110);
  return iVar5;
}

Assistant:

int Linenoise::CompleteLine(EscapeSequence &current_sequence) {
	int nread, nwritten;
	char c = 0;

	auto completion_list = TabComplete();
	auto &completions = completion_list.completions;
	if (completions.empty()) {
		Terminal::Beep();
	} else {
		bool stop = false;
		bool accept_completion = false;
		idx_t i = 0;

		while (!stop) {
			/* Show completion or original buffer */
			if (i < completions.size()) {
				Linenoise saved = *this;

				len = completions[i].completion.size();
				pos = completions[i].cursor_pos;
				buf = (char *)completions[i].completion.c_str();
				RefreshLine();
				len = saved.len;
				pos = saved.pos;
				buf = saved.buf;
			} else {
				RefreshLine();
			}

			nread = read(ifd, &c, 1);
			if (nread <= 0) {
				return -1;
			}

			Linenoise::Log("\nComplete Character %d\n", (int)c);
			switch (c) {
			case TAB: /* tab */
				i = (i + 1) % completions.size();
				break;
			case ESC: { /* escape */
				auto escape = Terminal::ReadEscapeSequence(ifd);
				switch (escape) {
				case EscapeSequence::SHIFT_TAB:
					// shift-tab: move backwards
					if (i == 0) {
						// pressing shift-tab at the first completion cancels completion
						RefreshLine();
						current_sequence = escape;
						stop = true;
					} else {
						i--;
					}
					break;
				case EscapeSequence::ESCAPE:
					/* Re-show original buffer */
					RefreshLine();
					current_sequence = escape;
					stop = true;
					break;
				default:
					current_sequence = escape;
					accept_completion = true;
					stop = true;
					break;
				}
				break;
			}
			default:
				accept_completion = true;
				stop = true;
				break;
			}
			if (stop && accept_completion && i < completions.size()) {
				/* Update buffer and return */
				if (i < completions.size()) {
					nwritten = snprintf(buf, buflen, "%s", completions[i].completion.c_str());
					pos = completions[i].cursor_pos;
					len = nwritten;
				}
			}
		}
	}
	return c; /* Return last read character */
}